

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_CreateBoxTest(Gia_Man_t *p)

{
  Acec_Box_t *p_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  Vec_Int_t *vAdds_00;
  abctime aVar8;
  Vec_Wec_t *p_01;
  Vec_Int_t *vTree_00;
  uint local_3c;
  int nFadds;
  int i;
  Vec_Int_t *vAdds;
  abctime clk;
  Vec_Int_t *vTree;
  Vec_Wec_t *vTrees;
  Acec_Box_t *pBox;
  Gia_Man_t *p_local;
  
  pBox = (Acec_Box_t *)p;
  aVar7 = Abc_Clock();
  vAdds_00 = Ree_ManComputeCuts((Gia_Man_t *)pBox,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds_00);
  iVar2 = Vec_IntSize(vAdds_00);
  iVar3 = Vec_IntSize(vAdds_00);
  printf("Detected %d adders (%d FAs and %d HAs).  ",(ulong)(uint)(iVar2 / 6),(ulong)uVar1,
         (ulong)(iVar3 / 6 - uVar1));
  aVar8 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar8 - aVar7);
  aVar7 = Abc_Clock();
  p_01 = Acec_TreeFindTrees((Gia_Man_t *)pBox,vAdds_00,(Vec_Bit_t *)0x0,0,0);
  uVar1 = Vec_WecSize(p_01);
  iVar2 = Vec_WecSizeSize(p_01);
  printf("Collected %d trees with %d adders in them.  ",(ulong)uVar1,(long)iVar2 / 2 & 0xffffffff);
  aVar8 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar8 - aVar7);
  for (local_3c = 0; iVar2 = Vec_WecSize(p_01), (int)local_3c < iVar2; local_3c = local_3c + 1) {
    Vec_WecEntry(p_01,local_3c);
    p_00 = pBox;
    vTree_00 = Vec_WecEntry(p_01,local_3c);
    vTrees = (Vec_Wec_t *)Acec_CreateBox((Gia_Man_t *)p_00,vAdds_00,vTree_00);
    uVar1 = Vec_WecSize(((Acec_Box_t *)vTrees)->vAdds);
    uVar4 = Vec_WecSizeSize((Vec_Wec_t *)vTrees->pArray);
    uVar5 = Vec_WecSizeSize(*(Vec_Wec_t **)(vTrees + 1));
    uVar6 = Vec_WecSizeSize((Vec_Wec_t *)vTrees[1].pArray);
    printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",
           (ulong)local_3c,(ulong)uVar1,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    Acec_TreePrintBox((Acec_Box_t *)vTrees,vAdds_00);
    Acec_BoxFreeP((Acec_Box_t **)&vTrees);
  }
  Vec_WecFree(p_01);
  Vec_IntFree(vAdds_00);
  return;
}

Assistant:

void Acec_CreateBoxTest( Gia_Man_t * p )
{
    Acec_Box_t * pBox;
    Vec_Wec_t * vTrees;
    Vec_Int_t * vTree;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    //Vec_WecPrint( vTrees, 0 );

    Vec_WecForEachLevel( vTrees, vTree, i )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, i) );
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            i, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
        Acec_TreePrintBox( pBox, vAdds );
        Acec_BoxFreeP( &pBox );
    }

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}